

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<double> __thiscall
ear::QuadRegion::_pan(QuadRegion *this,Vector3d *position,Matrix3d *polyBasis)

{
  double dVar1;
  double *extraout_RAX;
  undefined8 uVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  optional<double> oVar6;
  vector<double,_std::allocator<double>_> local_20;
  
  dVar4 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar5 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  dVar1 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  real_quadratic_roots
            (&local_20,
             dVar1 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[6] +
             dVar5 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[3] +
             (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
             m_data.array[0] * dVar4,
             dVar1 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[7] +
             dVar5 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[4] +
             (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
             m_data.array[1] * dVar4,
             dVar1 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[8] +
             dVar5 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[5] +
             dVar4 * (polyBasis->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[2]);
  dVar4 = extraout_XMM0_Qa;
  pdVar3 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pdVar3 == local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dVar4 = extraout_XMM0_Qa_00;
      }
      uVar2 = 0;
LAB_00136226:
      oVar6.super_type.m_storage = dVar4;
      oVar6.super_type._0_8_ = uVar2;
      return (optional<double>)oVar6.super_type;
    }
    dVar4 = *pdVar3;
    if ((-1e-10 < dVar4) && (dVar4 < 1.0000000001)) {
      dVar5 = 1.0;
      if (dVar4 <= 1.0) {
        dVar5 = dVar4;
      }
      dVar4 = (double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar5);
      if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = extraout_RAX;
      }
      uVar2 = CONCAT71((int7)((ulong)local_20.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_finish >> 8),1);
      goto LAB_00136226;
    }
    pdVar3 = pdVar3 + 1;
  } while( true );
}

Assistant:

std::pair<std::vector<Channel>, Eigen::MatrixXd> extraPosVerticalNominal(
      Layout layout) {
    std::vector<Channel> extraChannels;
    Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(
        layout.channels().size(), layout.channels().size());

    Layout midLayerLayout;
    std::copy_if(layout.channels().begin(), layout.channels().end(),
                 std::back_inserter(midLayerLayout.channels()), [](Channel c) {
                   return -10 <= c.polarPositionNominal().elevation &&
                          c.polarPositionNominal().elevation <= 10;
                 });

    auto layers = {std::make_tuple(-30.0, -70.0, -10.0),
                   std::make_tuple(30.0, 10.0, 70.0)};

    double layerNominalElevation, layerLowerBound, layerUpperBound;
    for (const auto& layer : layers) {
      std::tie(layerNominalElevation, layerLowerBound, layerUpperBound) = layer;

      Layout currentLayerLayout;
      std::copy_if(
          layout.channels().begin(), layout.channels().end(),
          std::back_inserter(currentLayerLayout.channels()), [&](Channel c) {
            return layerLowerBound <= c.polarPositionNominal().elevation &&
                   c.polarPositionNominal().elevation <= layerUpperBound;
          });

      // for each loudspeaker in the mid layer that has an azimuth greater
      // than az_limit, add a virtual speaker directly above/below it at the
      // elevation of the current layer, which is downmixed directly to the
      // mid layer loudspeaker. az_limit is set to the range of azimuths in
      // the current layer, with some space added to prevent fast vertical
      // source movements when sources move horizontally. If there are no
      // channels on this layer then a copy of all mid layer speakers is
      // made.
      double azimuthLimit = 0.0;
      double layerRealElevation = 0.0;
      if (currentLayerLayout.channels().size() != 0) {
        double azimuthRange = std::numeric_limits<double>::min();
        for (const auto& channel : currentLayerLayout.channels()) {
          if (azimuthRange < std::abs(channel.polarPositionNominal().azimuth)) {
            azimuthRange = std::abs(channel.polarPositionNominal().azimuth);
          }
        }
        azimuthLimit = azimuthRange + 40.0;
        layerRealElevation =
            std::accumulate(currentLayerLayout.channels().begin(),
                            currentLayerLayout.channels().end(), 0.0,
                            [&](double sum, const Channel& c) -> double {
                              return sum + c.polarPosition().elevation;
                            }) /
            static_cast<double>(currentLayerLayout.channels().size());
      } else {
        layerRealElevation = layerNominalElevation;
      }

      double epsilon = 1e-5;
      for (const auto& midChannel : midLayerLayout.channels()) {
        if (std::abs(midChannel.polarPosition().azimuth) >=
            azimuthLimit - epsilon) {
          extraChannels.push_back(Channel(
              "extra",
              PolarPosition(midChannel.polarPosition().azimuth,
                            layerRealElevation, 1.0),
              PolarPosition(midChannel.polarPositionNominal().azimuth,
                            layerNominalElevation, 1.0)

                  ));
          Eigen::VectorXd downmixRow =
              Eigen::VectorXd::Zero(layout.channels().size());
          auto names = layout.channelNames();
          int midChannelIndex = static_cast<int>(std::distance(
              names.begin(),
              std::find(names.begin(), names.end(), midChannel.name())));
          downmixRow(midChannelIndex) = 1.0;
          downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
          downmix.row(downmix.rows() - 1) = downmixRow;
        }
      }
    }
    return std::make_pair(extraChannels, downmix);
  }